

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O2

bool cmForEachCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  size_type *__result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  cmMakefile *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string *psVar2;
  int iVar3;
  cmMakefile *pcVar4;
  _Alloc_hider _Var5;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  string *psVar9;
  pointer pbVar10;
  int iVar11;
  pointer __p;
  int iVar12;
  pointer pbVar13;
  int iVar14;
  string *this_01;
  string_view value;
  int step;
  int stop;
  string result;
  string local_90;
  long local_70;
  __uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> local_68;
  int start;
  ulong local_40;
  cmMakefile *local_38;
  
  pbVar13 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar13 == pbVar10) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,"called with incorrect number of arguments",
               (allocator<char> *)&local_90);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&result);
LAB_003bca45:
    bVar7 = false;
  }
  else {
    __last = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[3]>>
                       (pbVar13,pbVar10,"IN");
    if (__last._M_current !=
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = status->Makefile;
      result._M_dataplus._M_p = (pointer)this_00;
      std::make_unique<(anonymous_namespace)::cmForEachFunctionBlocker,cmMakefile*>
                ((cmMakefile **)&stop);
      pcVar4 = _stop;
      __result = &(_stop->Targets)._M_h._M_element_count;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<std::__cxx11::string_const*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,__last._M_current,
                 (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )__result);
      local_70 = *(long *)&(pcVar4->Targets)._M_h._M_rehash_policy -
                 (pcVar4->Targets)._M_h._M_element_count;
      local_40 = local_70 >> 5;
      local_38 = pcVar4;
      *(ulong *)&(pcVar4->AliasTargets)._M_t._M_impl = local_40;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      iVar12 = 0;
      do {
        while( true ) {
          pcVar4 = local_38;
          uVar6 = local_40;
          __last._M_current = __last._M_current + 1;
          if (__last._M_current == pbVar1) {
            if ((1 < local_40 && iVar12 == 3) &&
               (local_70 >> 4 !=
                (long)(*(long *)&(local_38->Targets)._M_h._M_rehash_policy -
                      (local_38->Targets)._M_h._M_element_count) >> 5)) {
              std::__cxx11::to_string(&local_90,local_40);
              std::__cxx11::to_string
                        ((string *)&start,
                         ((long)(*(long *)&(pcVar4->Targets)._M_h._M_rehash_policy -
                                (pcVar4->Targets)._M_h._M_element_count) >> 5) - uVar6);
              cmStrCat<char_const(&)[10],std::__cxx11::string,char_const(&)[28],std::__cxx11::string>
                        (&result,(char (*) [10])"Expected ",&local_90,
                         (char (*) [28])" list variables, but given ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&start
                        );
              cmMakefile::IssueMessage(this_00,FATAL_ERROR,&result);
              std::__cxx11::string::~string((string *)&result);
              std::__cxx11::string::~string((string *)&start);
              psVar9 = &local_90;
              goto LAB_003bcc52;
            }
            _stop = (cmMakefile *)0x0;
            result._M_dataplus._M_p = (pointer)local_38;
            cmMakefile::AddFunctionBlocker
                      (this_00,(unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>
                                *)&result);
            if (result._M_dataplus._M_p != (pointer)0x0) {
              (**(code **)(*(long *)result._M_dataplus._M_p + 8))();
            }
            result._M_dataplus._M_p = (pointer)0x0;
            goto LAB_003bcc57;
          }
          bVar7 = std::operator==(__last._M_current,"LISTS");
          if (bVar7) break;
          bVar7 = std::operator==(__last._M_current,"ITEMS");
          if (bVar7) {
            if (iVar12 == 3) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&result,"ZIP_LISTS can not be used with LISTS or ITEMS",
                         (allocator<char> *)&local_90);
              cmMakefile::IssueMessage(this_00,FATAL_ERROR,&result);
              goto LAB_003bcc4d;
            }
            iVar12 = 2;
            if (local_70 != 0x20) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&result,"ITEMS or LISTS require exactly one iteration variable",
                         (allocator<char> *)&local_90);
              cmMakefile::IssueMessage(this_00,FATAL_ERROR,&result);
              goto LAB_003bcc4d;
            }
          }
          else {
            bVar7 = std::operator==(__last._M_current,"ZIP_LISTS");
            if (bVar7) {
              if (iVar12 != 0) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&result,"ZIP_LISTS can not be used with LISTS or ITEMS",
                           (allocator<char> *)&local_90);
                cmMakefile::IssueMessage(this_00,FATAL_ERROR,&result);
                goto LAB_003bcc4d;
              }
              *(undefined1 *)
               &(_stop->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                   _S_black;
              iVar12 = 3;
            }
            else {
              if (iVar12 == 0) {
                cmStrCat<char_const(&)[19],char_const(&)[3],std::__cxx11::string_const&,char_const(&)[2]>
                          (&result,(char (*) [19])"Unknown argument:\n",(char (*) [3])0x7840d1,
                           __last._M_current,(char (*) [2])0x7d0796);
                cmMakefile::IssueMessage(this_00,FATAL_ERROR,&result);
                goto LAB_003bcc4d;
              }
              if (iVar12 == 1) {
                psVar9 = cmMakefile::GetSafeDefinition(this_00,__last._M_current);
                iVar12 = 1;
                if (psVar9->_M_string_length != 0) {
                  value._M_str = (psVar9->_M_dataplus)._M_p;
                  value._M_len = psVar9->_M_string_length;
                  cmList::append((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)__result,value,Yes);
                  iVar12 = 1;
                }
              }
              else {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)__result,__last._M_current);
              }
            }
          }
        }
        if (iVar12 == 3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"ZIP_LISTS can not be used with LISTS or ITEMS",
                     (allocator<char> *)&local_90);
          cmMakefile::IssueMessage(this_00,FATAL_ERROR,&result);
          goto LAB_003bcc4d;
        }
        iVar12 = 1;
      } while (local_70 == 0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&result,"ITEMS or LISTS require exactly one iteration variable",
                 (allocator<char> *)&local_90);
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&result);
LAB_003bcc4d:
      psVar9 = &result;
LAB_003bcc52:
      std::__cxx11::string::~string((string *)psVar9);
LAB_003bcc57:
      if (_stop != (cmMakefile *)0x0) {
        (*(code *)(_stop->FindPackageRootPathStack).
                  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_map[1])();
      }
      return true;
    }
    result._M_dataplus._M_p = (pointer)status->Makefile;
    std::make_unique<(anonymous_namespace)::cmForEachFunctionBlocker,cmMakefile*>
              ((cmMakefile **)&local_90);
    pbVar13 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar13) < 0x21) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_90._M_dataplus._M_p + 0x98),args);
    }
    else {
      bVar7 = std::operator==(pbVar13 + 1,"RANGE");
      if (bVar7) {
        start = 0;
        _stop = (cmMakefile *)((ulong)_stop & 0xffffffff00000000);
        step = 0;
        pbVar13 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar10 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if ((long)pbVar10 - (long)pbVar13 == 0x60) {
          bVar7 = anon_unknown.dwarf_11d9e95::TryParseInteger(status,pbVar13 + 2,&stop);
          if (bVar7) {
            pbVar13 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pbVar10 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            goto LAB_003bcad0;
          }
        }
        else {
LAB_003bcad0:
          if ((long)pbVar10 - (long)pbVar13 == 0x80) {
            bVar7 = anon_unknown.dwarf_11d9e95::TryParseInteger(status,pbVar13 + 2,&start);
            if ((!bVar7) ||
               (bVar7 = anon_unknown.dwarf_11d9e95::TryParseInteger
                                  (status,(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + 3,&stop),
               !bVar7)) goto LAB_003bceba;
            pbVar13 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pbVar10 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          }
          if (((long)pbVar10 - (long)pbVar13 != 0xa0) ||
             (((bVar7 = anon_unknown.dwarf_11d9e95::TryParseInteger(status,pbVar13 + 2,&start),
               bVar7 && (bVar7 = anon_unknown.dwarf_11d9e95::TryParseInteger
                                           (status,(args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 3,
                                            &stop), bVar7)) &&
              (bVar7 = anon_unknown.dwarf_11d9e95::TryParseInteger
                                 (status,(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 4,&step),
              bVar7)))) {
            iVar12 = start;
            _Var5._M_p = local_90._M_dataplus._M_p;
            if (step == 0) {
              if (start <= stop) {
                step = 1;
                goto LAB_003bce41;
              }
              step = -1;
              bVar7 = true;
LAB_003bce51:
              iVar3 = step;
              if (-1 < step || stop <= start) {
                iVar11 = start - stop;
                iVar8 = -(start - stop);
                if (stop <= start) {
                  iVar8 = 0;
                }
                iVar14 = -step;
                if (0 < step) {
                  iVar14 = step;
                }
                if (!bVar7) {
                  iVar11 = 0;
                }
                this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(local_90._M_dataplus._M_p + 0x98);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::resize(this,(ulong)(iVar8 / iVar14 + iVar11 / iVar14 + 2));
                std::__cxx11::string::_M_assign
                          ((string *)
                           (this->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
                this_01 = *(string **)(_Var5._M_p + 0x98);
                psVar2 = *(string **)(_Var5._M_p + 0xa0);
                while (this_01 = this_01 + 0x20, this_01 != psVar2) {
                  std::__cxx11::to_string(&result,iVar12);
                  iVar12 = iVar12 + iVar3;
                  std::__cxx11::string::operator=(this_01,(string *)&result);
                  std::__cxx11::string::~string((string *)&result);
                }
                goto LAB_003bcc95;
              }
            }
            else {
LAB_003bce41:
              bVar7 = stop < start;
              if (!bVar7 || step < 1) goto LAB_003bce51;
            }
            cmStrCat<char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&>
                      (&result,(char (*) [50])"called with incorrect range specification: start ",
                       &start,(char (*) [8])", stop ",&stop,(char (*) [8])", step ",&step);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            std::__cxx11::string::~string((string *)&result);
            cmSystemTools::s_FatalErrorOccurred = true;
          }
        }
LAB_003bceba:
        if ((long *)local_90._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_90._M_dataplus._M_p + 8))();
        }
        goto LAB_003bca45;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_90._M_dataplus._M_p + 0x98),args);
    }
LAB_003bcc95:
    *(long *)((long)local_90._M_dataplus._M_p + 0xb8) = 1;
    local_68._M_t.
    super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
    super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
         (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
         (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
         local_90._M_dataplus._M_p;
    cmMakefile::AddFunctionBlocker
              (status->Makefile,
               (unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)&local_68);
    bVar7 = true;
    if ((_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
        local_68._M_t.
        super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
        super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl != (cmFunctionBlocker *)0x0)
    {
      (**(code **)(*(long *)local_68._M_t.
                            super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                            .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8))();
    }
  }
  return bVar7;
}

Assistant:

bool cmForEachCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  auto kwInIter = std::find(args.begin(), args.end(), "IN");
  if (kwInIter != args.end()) {
    return HandleInMode(args, kwInIter, status.GetMakefile());
  }

  // create a function blocker
  auto fb = cm::make_unique<cmForEachFunctionBlocker>(&status.GetMakefile());
  if (args.size() > 1) {
    if (args[1] == "RANGE") {
      int start = 0;
      int stop = 0;
      int step = 0;
      if (args.size() == 3) {
        if (!TryParseInteger(status, args[2], stop)) {
          return false;
        }
      }
      if (args.size() == 4) {
        if (!TryParseInteger(status, args[2], start)) {
          return false;
        }
        if (!TryParseInteger(status, args[3], stop)) {
          return false;
        }
      }
      if (args.size() == 5) {
        if (!TryParseInteger(status, args[2], start)) {
          return false;
        }
        if (!TryParseInteger(status, args[3], stop)) {
          return false;
        }
        if (!TryParseInteger(status, args[4], step)) {
          return false;
        }
      }
      if (step == 0) {
        if (start > stop) {
          step = -1;
        } else {
          step = 1;
        }
      }
      if ((start > stop && step > 0) || (start < stop && step < 0) ||
          step == 0) {
        status.SetError(
          cmStrCat("called with incorrect range specification: start ", start,
                   ", stop ", stop, ", step ", step));
        cmSystemTools::SetFatalErrorOccurred();
        return false;
      }

      // Calculate expected iterations count and reserve enough space
      // in the `fb->Args` vector. The first item is the iteration variable
      // name...
      const std::size_t iter_cnt = 2u +
        static_cast<int>(start < stop) * (stop - start) / std::abs(step) +
        static_cast<int>(start > stop) * (start - stop) / std::abs(step);
      fb->Args.resize(iter_cnt);
      fb->Args.front() = args.front();
      auto cc = start;
      auto generator = [&cc, step]() -> std::string {
        auto result = std::to_string(cc);
        cc += step;
        return result;
      };
      // Fill the `range` vector w/ generated string values
      // (starting from 2nd position)
      std::generate(++fb->Args.begin(), fb->Args.end(), generator);
    } else {
      fb->Args = args;
    }
  } else {
    fb->Args = args;
  }

  fb->SetIterationVarsCount(1u);
  status.GetMakefile().AddFunctionBlocker(std::move(fb));

  return true;
}